

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O3

float get_pmin(float sum_loss,float t)

{
  float fVar1;
  float fVar2;
  
  if (2.0 < t) {
    fVar1 = (sum_loss / t) * t;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar2 = logf(t);
    fVar1 = 1.0 / (fVar2 + fVar1);
    if (0.5 <= fVar1) {
      fVar1 = 0.5;
    }
    return fVar1;
  }
  return 1.0;
}

Assistant:

float get_pmin(float sum_loss, float t)
{
  // t = ec.example_t - 1
  if (t <= 2.f)
  {
    return 1.f;
  }

  float avg_loss = sum_loss / t;
  float pmin = fmin(1.f / (sqrt(t * avg_loss) + log(t)), 0.5f);
  return pmin;  // treating n*eps_n = 1
}